

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

void __thiscall libtorrent::torrent_info::internal_set_creator(torrent_info *this,string_view c)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string local_30 [32];
  
  local_40._M_str = c._M_str;
  local_40._M_len = c._M_len;
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_30,&local_40,&local_41);
  ::std::__cxx11::string::operator=((string *)&this->m_created_by,local_30);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void torrent_info::internal_set_creator(string_view const c)
	{ m_created_by = std::string(c); }